

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_common.h
# Opt level: O1

void __thiscall cfd::SignParameter::~SignParameter(SignParameter *this)

{
  *(undefined ***)(this + 0x48) = &PTR__ScriptOperator_002e17b0;
  if (*(SignParameter **)(this + 0x58) != this + 0x68) {
    operator_delete(*(SignParameter **)(this + 0x58));
  }
  if (*(void **)(this + 0x20) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x20));
  }
  if (*(void **)this != (void *)0x0) {
    operator_delete(*(void **)this);
    return;
  }
  return;
}

Assistant:

class CFD_EXPORT SignParameter {
 public:
  /**
   * @brief constructor(for vector)
   */
  SignParameter();
  /**
   * @brief constructor(Type: auto)
   * @param[in] text_message            text data
   * @param[in] der_encode              flag of need der encode
   * @param[in] sighash_type            sighash type (SigHashType)
   */
  explicit SignParameter(
      const std::string& text_message, bool der_encode = false,
      const SigHashType sighash_type =
          SigHashType(SigHashAlgorithm::kSigHashAll));
  /**
   * @brief constructor(Type: Sign)
   * @param[in] data                    byte data
   * @param[in] der_encode              flag of need der encode
   * @param[in] sighash_type            sighash type (SigHashType)
   */
  explicit SignParameter(
      const ByteData& data, bool der_encode,
      const SigHashType sighash_type =
          SigHashType(SigHashAlgorithm::kSigHashAll));
  /**
   * @brief constructor(Type: Binary)
   * @param[in] data  data
   */
  explicit SignParameter(const ByteData& data);
  /**
   * @brief constructor(Type: Pubkey)
   * @param[in] pubkey  pubkey data
   */
  explicit SignParameter(const Pubkey& pubkey);
  /**
   * @brief constructor(Type: RedeemScript)
   * @param[in] redeem_script  redeem script data
   */
  explicit SignParameter(const Script& redeem_script);
  /**
   * @brief constructor(Type: ScriptOperator)
   * @param[in] op_code  op code
   */
  explicit SignParameter(const ScriptOperator& op_code);
  /**
   * @brief copy constructor.
   * @param[in] sign_parameter     object
   */
  SignParameter(const SignParameter& sign_parameter);
  /**
   * @brief copy constructor.
   * @param[in] sign_parameter     object
   * @return object
   */
  SignParameter& operator=(const SignParameter& sign_parameter);
  /**
   * @brief Set the related pubkey.
   * @param[in] pubkey  realated pubkey
   */
  void SetRelatedPubkey(const Pubkey& pubkey);

  /**
   * @brief Get data
   * @return data
   */
  ByteData GetData() const;
  /**
   * @brief get op_code.
   * @return op_code
   */
  ScriptOperator GetOpCode() const;
  /**
   * @brief check op_code.
   * @retval true op_code
   * @retval false other value
   */
  bool IsOpCode() const;
  /**
   * @brief Get data type
   * @return data
   */
  SignDataType GetDataType() const;
  /**
   * @brief Get RelatedPubkey
   * @return related pubkey data
   */
  Pubkey GetRelatedPubkey() const;
  /**
   * @brief Get DerEncode
   * @return der encode use flag
   */
  bool IsDerEncode() const;
  /**
   * @brief Get sighash type
   * @return sighash type
   */
  SigHashType GetSigHashType() const;
  /**
   * @brief Convert data to signature with stored information
   * @return signature data
   */
  ByteData ConvertToSignature() const;

 private:
  ByteData data_;             //!< data hex
  SignDataType data_type_;    //!< data type
  Pubkey related_pubkey_;     //!< need der encode flag
  bool der_encode_;           //!< sighash type
  SigHashType sighash_type_;  //!< AnyoneCanPay flag
  ScriptOperator op_code_;    //!< op_code
}